

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::url_seed_alert::message_abi_cxx11_(string *__return_storage_ptr__,url_seed_alert *this)

{
  char *__rhs;
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  url_seed_alert *local_18;
  url_seed_alert *this_local;
  
  local_18 = this;
  this_local = (url_seed_alert *)__return_storage_ptr__;
  torrent_alert::message_abi_cxx11_(&local_98,&this->super_torrent_alert);
  ::std::operator+(&local_78,&local_98," url seed (");
  __rhs = server_url(this);
  ::std::operator+(&local_58,&local_78,__rhs);
  ::std::operator+(&local_38,&local_58,") failed: ");
  boost::system::error_code::message_abi_cxx11_(&local_c8,&this->error);
  ::std::operator+(__return_storage_ptr__,&local_38,&local_c8);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string url_seed_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		return torrent_alert::message() + " url seed ("
			+ server_url() + ") failed: " + error.message();
#endif
	}